

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_disconnect(connectdata *conn,_Bool dead_connection)

{
  Curl_easy *data;
  CURLcode CVar1;
  char *pcVar2;
  undefined7 in_register_00000031;
  pingpong *pp;
  
  if ((int)CONCAT71(in_register_00000031,dead_connection) != 0) {
    (conn->proto).ftpc.ctl_valid = false;
  }
  if ((conn->proto).ftpc.ctl_valid == true) {
    CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s","QUIT");
    if (CVar1 == CURLE_OK) {
      (conn->proto).ftpc.state = FTP_QUIT;
      do {
        if ((conn->proto).ftpc.state == FTP_STOP) break;
        CVar1 = Curl_pp_statemach(&(conn->proto).ftpc.pp,true,true);
      } while (CVar1 == CURLE_OK);
    }
    else {
      data = conn->data;
      pcVar2 = curl_easy_strerror(CVar1);
      Curl_failf(data,"Failure sending QUIT command: %s",pcVar2);
      (conn->proto).ftpc.ctl_valid = false;
      Curl_conncontrol(conn,1);
      (conn->proto).ftpc.state = FTP_STOP;
    }
  }
  pcVar2 = (conn->proto).ftpc.entrypath;
  if (pcVar2 != (char *)0x0) {
    if ((conn->data->state).most_recent_ftp_entrypath == pcVar2) {
      (conn->data->state).most_recent_ftp_entrypath = (char *)0x0;
    }
    (*Curl_cfree)(pcVar2);
    (conn->proto).ftpc.entrypath = (char *)0x0;
  }
  freedirs(&(conn->proto).ftpc);
  (*Curl_cfree)((conn->proto).ftpc.prevpath);
  (conn->proto).ftpc.prevpath = (char *)0x0;
  (*Curl_cfree)((conn->proto).ftpc.server_os);
  (conn->proto).ftpc.server_os = (char *)0x0;
  Curl_pp_disconnect(&(conn->proto).ftpc.pp);
  return CURLE_OK;
}

Assistant:

static CURLcode ftp_disconnect(struct connectdata *conn, bool dead_connection)
{
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;

  /* We cannot send quit unconditionally. If this connection is stale or
     bad in any way, sending quit and waiting around here will make the
     disconnect wait in vain and cause more problems than we need to.

     ftp_quit() will check the state of ftp->ctl_valid. If it's ok it
     will try to send the QUIT command, otherwise it will just return.
  */
  if(dead_connection)
    ftpc->ctl_valid = FALSE;

  /* The FTP session may or may not have been allocated/setup at this point! */
  (void)ftp_quit(conn); /* ignore errors on the QUIT */

  if(ftpc->entrypath) {
    struct Curl_easy *data = conn->data;
    if(data->state.most_recent_ftp_entrypath == ftpc->entrypath) {
      data->state.most_recent_ftp_entrypath = NULL;
    }
    free(ftpc->entrypath);
    ftpc->entrypath = NULL;
  }

  freedirs(ftpc);
  free(ftpc->prevpath);
  ftpc->prevpath = NULL;
  free(ftpc->server_os);
  ftpc->server_os = NULL;

  Curl_pp_disconnect(pp);

#ifdef HAVE_GSSAPI
  Curl_sec_end(conn);
#endif

  return CURLE_OK;
}